

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Stress::anon_unknown_0::OutputCase::testFBO(OutputCase *this)

{
  RenderContext *context;
  TestLog *this_00;
  OutputCase *pOVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  deUint32 dVar5;
  ChannelOrder CVar6;
  long lVar7;
  pointer puVar8;
  undefined4 extraout_var;
  unsigned_short uVar9;
  int y;
  long lVar10;
  size_t __n;
  ConstPixelBufferAccess *pCVar11;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int x_00;
  char *pcVar12;
  TextureLevel *this_01;
  TestContext *this_02;
  int x;
  int y_00;
  ChannelOrder *pCVar13;
  int y_1;
  int iVar14;
  float fVar15;
  allocator<char> local_514;
  allocator<char> local_513;
  allocator<char> local_512;
  allocator<char> local_511;
  allocator<char> local_510;
  allocator<char> local_50f;
  allocator<char> local_50e;
  allocator<char> local_50d;
  undefined4 local_50c;
  OutputCase *local_508;
  Surface errorMask;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  TextureFormat textureFormat;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  TextureLevel specialImage;
  TextureLevel normalImage;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  LogImageSet local_360;
  Vec4 cNormal;
  ConstPixelBufferAccess local_290;
  ConstPixelBufferAccess local_268;
  Vec4 cSpecial;
  deUint32 uniformValue;
  ChannelType CStack_1ac;
  ostringstream local_1a8 [376];
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&gridVertices,0x2e,(allocator_type *)&uniformValue);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&indices,0x84,(allocator_type *)&uniformValue);
  textureFormat.type =
       (uint)((*(uint *)&(this->super_FramebufferRenderCase).super_RenderCase.field_0x84 &
              0xfffffffe) == 6) << 5 | UNORM_INT8;
  textureFormat.order = RGBA;
  tcu::TextureLevel::TextureLevel(&specialImage,&textureFormat,0x100,0x100,1);
  tcu::TextureLevel::TextureLevel(&normalImage,&textureFormat,0x100,0x100,1);
  lVar7 = 0;
  for (lVar10 = 0; lVar10 != 0x17; lVar10 = lVar10 + 1) {
    fVar15 = (float)(int)lVar10 / 22.0;
    fVar15 = fVar15 + fVar15 + -1.0;
    *(undefined4 *)
     ((long)(gridVertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar7) = 0xbf800000;
    *(float *)((long)(gridVertices.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7 + 4) = fVar15;
    *(undefined8 *)
     ((long)(gridVertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar7 + 8) = 0x3f80000000000000;
    *(undefined4 *)
     ((long)gridVertices.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[1].m_data + lVar7) = 0x3f800000;
    *(float *)((long)gridVertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar7 + 4) = fVar15;
    *(undefined8 *)
     ((long)gridVertices.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[1].m_data + lVar7 + 8) = 0x3f80000000000000;
    lVar7 = lVar7 + 0x20;
  }
  puVar8 = indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 5;
  lVar7 = 0;
  while (lVar7 != 0x2c) {
    uVar9 = (unsigned_short)lVar7;
    puVar8[-5] = uVar9;
    lVar7 = lVar7 + 2;
    puVar8[-4] = (unsigned_short)lVar7;
    puVar8[-3] = uVar9 + 3;
    puVar8[-2] = uVar9;
    puVar8[-1] = uVar9 + 3;
    *puVar8 = uVar9 + 1;
    puVar8 = puVar8 + 6;
  }
  iVar2 = (*((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  uVar3 = (**(code **)(lVar7 + 0x780))
                    ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).
                     m_program,"a_pos");
  uVar4 = (**(code **)(lVar7 + 0xb48))
                    ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).
                     m_program,"u_special");
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar7 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar7 + 0x1680))
            ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).m_program
            );
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"pre-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x6b7);
  (**(code **)(lVar7 + 0x19f0))
            (uVar3,4,0x1406,0,0,
             gridVertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar7 + 0x610))(uVar3);
  local_50c = uVar3;
  local_508 = this;
  for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
    _uniformValue =
         (TextureFormat)
         ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"Pass ");
    std::ostream::operator<<(local_1a8,iVar2);
    std::operator<<((ostream *)local_1a8,
                    ": Drawing stripes with the shader. Setting u_special for each stripe to (");
    pcVar12 = "1.0";
    if (iVar2 == 0) {
      pcVar12 = "special";
    }
    std::operator<<((ostream *)local_1a8,pcVar12);
    std::operator<<((ostream *)local_1a8,").");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    (**(code **)(lVar7 + 0x188))(0x4000);
    pCVar13 = &(anonymous_namespace)::s_specialFloats;
    for (lVar10 = 0; lVar10 != 0x108; lVar10 = lVar10 + 0xc) {
      CVar6 = 0x3f800000;
      if (iVar2 == 0) {
        CVar6 = *pCVar13;
      }
      uniformValue = CVar6;
      (**(code **)(lVar7 + 0x14e8))(uVar4,1,(MessageBuilder *)&uniformValue);
      (**(code **)(lVar7 + 0x568))
                (4,6,0x1403,
                 (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10);
      pCVar13 = pCVar13 + 1;
    }
    (**(code **)(lVar7 + 0x648))();
    this = local_508;
    context = ((local_508->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
              m_renderCtx;
    this_01 = &normalImage;
    if (iVar2 == 0) {
      this_01 = &specialImage;
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&uniformValue,this_01);
    glu::readPixels(context,0,0,(PixelBufferAccess *)&uniformValue);
  }
  (**(code **)(lVar7 + 0x518))(local_50c);
  (**(code **)(lVar7 + 0x1680))(0);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  __n = 0x6d6;
  glu::checkError(dVar5,"OutputCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x6d6);
  tcu::Surface::Surface(&errorMask,0x100,0x100);
  _uniformValue =
       (TextureFormat)
       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,
                  "Checking passes have identical red and blue channels and the green channel is correct in the constant pass."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  iVar2 = 0;
  for (iVar14 = 0; pOVar1 = local_508, iVar14 < specialImage.m_size.m_data[1]; iVar14 = iVar14 + 1)
  {
    for (y_00 = 0; y_00 < specialImage.m_size.m_data[0]; y_00 = y_00 + 1) {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&uniformValue,&normalImage);
      x_00 = (int)(PixelBufferAccess *)&uniformValue;
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&cNormal,x_00,y_00,iVar14);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&uniformValue,&specialImage);
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&cSpecial,x_00,y_00,iVar14);
      if ((((cNormal.m_data[0] != cSpecial.m_data[0]) ||
           (NAN(cNormal.m_data[0]) || NAN(cSpecial.m_data[0]))) ||
          (cNormal.m_data[2] != cSpecial.m_data[2])) ||
         ((NAN(cNormal.m_data[2]) || NAN(cSpecial.m_data[2]) ||
          (uVar3 = 0xff00ff00, cNormal.m_data[1] < 0.9)))) {
        iVar2 = iVar2 + 1;
        uVar3 = 0xff0000ff;
      }
      __n = (size_t)(errorMask.m_width * iVar14 + y_00);
      *(undefined4 *)((long)errorMask.m_pixels.m_ptr + __n * 4) = uVar3;
    }
  }
  _uniformValue =
       (TextureFormat)
       ((local_508->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Found ");
  std::ostream::operator<<(local_1a8,iVar2);
  std::operator<<((ostream *)local_1a8," invalid pixel(s).");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  this_02 = (pOVar1->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx;
  if (iVar2 == 0) {
    pcVar12 = "Pass";
  }
  else {
    this_00 = this_02->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"Results",&local_50d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"Result verification",&local_50e);
    tcu::LogImageSet::LogImageSet(&local_360,&local_380,&local_3a0);
    iVar14 = (int)this_00;
    tcu::LogImageSet::write(&local_360,iVar14,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"Image with special green channel",&local_50f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"Image with special green channel",&local_510);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_268,&specialImage);
    pCVar11 = &local_268;
    tcu::LogImage::LogImage
              ((LogImage *)&uniformValue,&local_3c0,&local_3e0,pCVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&uniformValue,iVar14,__buf_00,(size_t)pCVar11);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"Image with constant green channel",&local_511);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"Image with constant green channel",&local_512);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_290,&normalImage);
    pCVar11 = &local_290;
    tcu::LogImage::LogImage
              ((LogImage *)&cNormal,&local_400,&local_420,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&cNormal,iVar14,__buf_01,(size_t)pCVar11);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"Error Mask",&local_513)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"Error Mask",&local_514)
    ;
    surface = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&cSpecial,&local_440,&local_460,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&cSpecial,iVar14,__buf_02,(size_t)surface);
    tcu::TestLog::endImageSet(this_00);
    tcu::LogImage::~LogImage((LogImage *)&cSpecial);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
    tcu::LogImage::~LogImage((LogImage *)&cNormal);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_400);
    tcu::LogImage::~LogImage((LogImage *)&uniformValue);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
    tcu::LogImageSet::~LogImageSet(&local_360);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    this_02 = (pOVar1->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    pcVar12 = "Image comparison failed";
  }
  tcu::TestContext::setTestResult(this_02,(uint)(iVar2 != 0),pcVar12);
  tcu::Surface::~Surface(&errorMask);
  tcu::TextureLevel::~TextureLevel(&normalImage);
  tcu::TextureLevel::~TextureLevel(&specialImage);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&gridVertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return;
}

Assistant:

void OutputCase::testFBO (void)
{
	// Create a 1 X [s_specialFloats] grid of tiles (stripes).
	std::vector<tcu::Vec4>	gridVertices	((DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) * 2);
	std::vector<deUint16>	indices			(DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::TextureFormat		textureFormat	(tcu::TextureFormat::RGBA, (m_fboType == FBO_RGBA_FLOAT16 || m_fboType == FBO_RGBA_FLOAT32) ? (tcu::TextureFormat::FLOAT) : (tcu::TextureFormat::UNORM_INT8));
	tcu::TextureLevel		specialImage	(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::TextureLevel		normalImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++y)
	{
		const float posY = (float)y / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) ] to [-1, 1]

		gridVertices[y * 2 + 0] = tcu::Vec4(-1.0, posY, 0.0f, 1.0f);
		gridVertices[y * 2 + 1] = tcu::Vec4( 1.0, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const int baseNdx = y * 6;

		indices[baseNdx + 0] = (deUint16)((y + 0) * 2);
		indices[baseNdx + 1] = (deUint16)((y + 1) * 2);
		indices[baseNdx + 2] = (deUint16)((y + 1) * 2 + 1);

		indices[baseNdx + 3] = (deUint16)((y + 0) * 2);
		indices[baseNdx + 4] = (deUint16)((y + 1) * 2 + 1);
		indices[baseNdx + 5] = (deUint16)((y + 0) * 2 + 1);
	}

	// Draw grids
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw");

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		// draw 2 passes. Special and normal.
		for (int passNdx = 0; passNdx < 2; ++passNdx)
		{
			const bool specialPass	= (passNdx == 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Pass " << passNdx << ": Drawing stripes with the shader. Setting u_special for each stripe to (" << ((specialPass) ? ("special") : ("1.0")) << ")." << tcu::TestLog::EndMessage;

			// draw stripes
			gl.clear(GL_COLOR_BUFFER_BIT);
			for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
			{
				const deUint32	one				= 0x3F800000;
				const deUint32	special			= s_specialFloats[y];
				const deUint32	uniformValue	= (specialPass) ? (special) : (one);
				const int		indexIndex		= y * 6;

				gl.uniform1fv(specialLoc, 1, (const float*)&uniformValue);
				gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
			}

			gl.finish();
			glu::readPixels(m_context.getRenderContext(), 0, 0, ((specialPass) ? (specialImage) : (normalImage)).getAccess());
		}

		gl.disableVertexAttribArray(positionLoc);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "OutputCase::iterate");
	}

	// Check results
	{
		tcu::Surface		errorMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const tcu::RGBA		badPixelColor	= tcu::RGBA::red();
		const tcu::RGBA		okPixelColor	= tcu::RGBA::green();
		int					badPixels		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Checking passes have identical red and blue channels and the green channel is correct in the constant pass." << tcu::TestLog::EndMessage;

		for (int y = 0; y < specialImage.getHeight(); ++y)
		for (int x = 0; x < specialImage.getWidth(); ++x)
		{
			const float		greenThreshold	= 0.1f;
			const tcu::Vec4	cNormal			= normalImage.getAccess().getPixel(x, y);
			const tcu::Vec4	cSpecial		= specialImage.getAccess().getPixel(x, y);

			if (cNormal.x() != cSpecial.x() || cNormal.z() != cSpecial.z() || cNormal.y() < 1.0f - greenThreshold)
			{
				++badPixels;
				errorMask.setPixel(x, y, badPixelColor);
			}
			else
				errorMask.setPixel(x, y, okPixelColor);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Found " << badPixels << " invalid pixel(s)." << tcu::TestLog::EndMessage;

		if (badPixels)
		{
			m_testCtx.getLog()
					<< tcu::TestLog::ImageSet("Results", "Result verification")
					<< tcu::TestLog::Image("Image with special green channel",	"Image with special green channel",		specialImage)
					<< tcu::TestLog::Image("Image with constant green channel",	"Image with constant green channel",	normalImage)
					<< tcu::TestLog::Image("Error Mask",						"Error Mask",							errorMask)
					<< tcu::TestLog::EndImageSet;

			// all ok?
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
}